

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

void __thiscall
kainjow::mustache::
parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
parse_tag_contents(parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *this,bool is_unescaped_var,
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *contents,
                  mstch_tag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *tag)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined8 local_70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined8 local_50;
  string local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  mstch_tag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *tag_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *contents_local;
  bool is_unescaped_var_local;
  parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  name.field_2._8_8_ = tag;
  if (is_unescaped_var) {
    tag->type = unescaped_variable;
    std::__cxx11::string::operator=((string *)tag,(string *)contents);
  }
  else {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      pcVar3 = (char *)std::__cxx11::string::at((ulong)contents);
      cVar1 = *pcVar3;
      if (cVar1 == '!') {
        *(undefined4 *)(name.field_2._8_8_ + 0x20) = 6;
      }
      else if (cVar1 == '#') {
        *(undefined4 *)(name.field_2._8_8_ + 0x20) = 3;
      }
      else if (cVar1 == '&') {
        *(undefined4 *)(name.field_2._8_8_ + 0x20) = 2;
      }
      else if (cVar1 == '/') {
        *(undefined4 *)(name.field_2._8_8_ + 0x20) = 4;
      }
      else if (cVar1 == '>') {
        *(undefined4 *)(name.field_2._8_8_ + 0x20) = 7;
      }
      else if (cVar1 == '^') {
        *(undefined4 *)(name.field_2._8_8_ + 0x20) = 5;
      }
      else {
        *(undefined4 *)(name.field_2._8_8_ + 0x20) = 1;
      }
      if (*(int *)(name.field_2._8_8_ + 0x20) == 1) {
        std::__cxx11::string::operator=((string *)name.field_2._8_8_,(string *)contents);
      }
      else {
        std::__cxx11::string::string(local_48,(string *)contents);
        local_58._M_current = (char *)std::__cxx11::string::begin();
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_50,&local_58);
        auVar4 = std::__cxx11::string::erase(local_48,local_50);
        local_70 = auVar4._0_8_;
        trim<std::__cxx11::string>(&local_90,(mustache *)local_48,auVar4._8_8_);
        std::__cxx11::string::operator=((string *)name.field_2._8_8_,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string(local_48);
      }
    }
    else {
      *(undefined4 *)(name.field_2._8_8_ + 0x20) = 1;
      std::__cxx11::string::clear();
    }
  }
  return;
}

Assistant:

void parse_tag_contents(bool is_unescaped_var, const string_type& contents, mstch_tag<string_type>& tag) const {
        if (is_unescaped_var) {
            tag.type = tag_type::unescaped_variable;
            tag.name = contents;
        } else if (contents.empty()) {
            tag.type = tag_type::variable;
            tag.name.clear();
        } else {
            switch (contents.at(0)) {
                case '#':
                    tag.type = tag_type::section_begin;
                    break;
                case '^':
                    tag.type = tag_type::section_begin_inverted;
                    break;
                case '/':
                    tag.type = tag_type::section_end;
                    break;
                case '>':
                    tag.type = tag_type::partial;
                    break;
                case '&':
                    tag.type = tag_type::unescaped_variable;
                    break;
                case '!':
                    tag.type = tag_type::comment;
                    break;
                default:
                    tag.type = tag_type::variable;
                    break;
            }
            if (tag.type == tag_type::variable) {
                tag.name = contents;
            } else {
                string_type name{contents};
                name.erase(name.begin());
                tag.name = trim(name);
            }
        }
    }